

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_C2S_REQUEST_check(void)

{
  int32_t iVar1;
  uint8_t local_1b7 [8];
  uint8_t buf7 [10];
  uint8_t buf6 [3];
  uint8_t buf5 [2];
  uint8_t buf4 [19];
  uint8_t local_188 [8];
  uint8_t buf3 [19];
  uint8_t local_168 [8];
  uint8_t buf2 [19];
  uint8_t local_148 [8];
  uint8_t buf1 [19];
  undefined1 local_128 [8];
  PipeMsg msg;
  
  MsgHelper::initMsg((PipeMsg *)local_128,C2S_REQUEST);
  builtin_memcpy(local_148,"\x01\x01\x03\rwww.",8);
  buf1[0] = 'b';
  buf1[1] = 'a';
  buf1[2] = 'i';
  buf1[3] = 'd';
  buf1[4] = 'u';
  buf1[5] = '.';
  buf1[6] = 'c';
  buf1[7] = 'o';
  buf1[8] = 'm';
  buf1[9] = 0x8c;
  buf1[10] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_148,0x13,(PipeMsg *)local_128);
  if (iVar1 != 0x13) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x6d,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)local_128);
  builtin_memcpy(local_168,"\x01\x01\x03\x0ewww.",8);
  buf2[0] = 'b';
  buf2[1] = 'a';
  buf2[2] = 'i';
  buf2[3] = 'd';
  buf2[4] = 'u';
  buf2[5] = '.';
  buf2[6] = 'c';
  buf2[7] = 'o';
  buf2[8] = 'm';
  buf2[9] = 0x8c;
  buf2[10] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_168,0x13,(PipeMsg *)local_128);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x77,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)local_128);
  builtin_memcpy(local_188,"\x01\x01\x03\fwww.",8);
  buf3[0] = 'b';
  buf3[1] = 'a';
  buf3[2] = 'i';
  buf3[3] = 'd';
  buf3[4] = 'u';
  buf3[5] = '.';
  buf3[6] = 'c';
  buf3[7] = 'o';
  buf3[8] = 'm';
  buf3[9] = 0x8c;
  buf3[10] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(local_188,0x13,(PipeMsg *)local_128);
  if (iVar1 != 0x12) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x80,"void test_C2S_REQUEST_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)local_128);
  stack0xfffffffffffffe58 = 0x2e77777700030101;
  iVar1 = MsgHelper::deserializeMsg(buf7 + 7,0x13,(PipeMsg *)local_128);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg((PipeMsg *)local_128);
    buf7[5] = '\x01';
    buf7[6] = 0xdd;
    iVar1 = MsgHelper::deserializeMsg(buf7 + 5,2,(PipeMsg *)local_128);
    if (iVar1 != -1) {
      __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                    ,0x8f,"void test_C2S_REQUEST_check()");
    }
    MsgHelper::destroyMsg((PipeMsg *)local_128);
    buf7[2] = '\x01';
    buf7[3] = '\x01';
    buf7[4] = 0xdd;
    iVar1 = MsgHelper::deserializeMsg(buf7 + 2,3,(PipeMsg *)local_128);
    if (iVar1 == -1) {
      MsgHelper::destroyMsg((PipeMsg *)local_128);
      local_1b7[0] = '\x01';
      local_1b7[1] = '\x01';
      local_1b7[2] = '\x01';
      local_1b7[3] = '/';
      local_1b7[4] = 'K';
      local_1b7[5] = 0xda;
      local_1b7[6] = 200;
      local_1b7[7] = 0xff;
      buf7[0] = 0xf1;
      buf7[1] = 0xdd;
      iVar1 = MsgHelper::deserializeMsg(local_1b7,10,(PipeMsg *)local_128);
      if (iVar1 == 9) {
        MsgHelper::destroyMsg((PipeMsg *)local_128);
        return;
      }
      __assert_fail("MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                    ,0x99,"void test_C2S_REQUEST_check()");
    }
    __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x94,"void test_C2S_REQUEST_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x8a,"void test_C2S_REQUEST_check()");
}

Assistant:

void test_C2S_REQUEST_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_REQUEST);
	
	const uint8_t buf1[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf2[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0E, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf3[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0C, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len (0x00)
	const uint8_t buf4[] = {
		0x01, 
		0x01, 
		0x03, 
		0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: cmd(0xdd) overflow
	const uint8_t buf5[] = {0x01, 0xdd,};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: atyp(0xdd) overflow
	const uint8_t buf6[] = {0x01,  0x01, 0xdd};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf7[] = {0x01, 0x01, 0x01, 0x2F, 0x4B, 0xDA, 0xC8, 0xFF, 0xF1, 0xDD};
	assert(MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9);
	MsgHelper::destroyMsg(&msg);
}